

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,string *dir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCTest *this_00;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  string sourceDirectory;
  ostringstream cmCTestLog_msg;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  char *local_180;
  undefined8 local_178;
  ios_base local_130 [264];
  
  pcVar2 = (dir->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar2,pcVar2 + dir->_M_string_length);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Check directory: ",0x11);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x10a,local_1c0._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
  paVar1 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  std::__cxx11::string::append((char *)&local_1e0);
  bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
  iVar5 = 2;
  if (!bVar3) {
    local_1a0._8_8_ = (dir->_M_dataplus)._M_p;
    local_1a0._0_8_ = dir->_M_string_length;
    local_190._M_allocated_capacity = 0;
    local_190._8_8_ = 4;
    local_180 = "/CVS";
    local_178 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_1a0;
    cmCatViews(&local_1c0,views);
    std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
    iVar5 = 1;
    if (!bVar3) {
      local_1a0._8_8_ = (dir->_M_dataplus)._M_p;
      local_1a0._0_8_ = dir->_M_string_length;
      local_190._M_allocated_capacity = 0;
      local_190._8_8_ = 5;
      local_180 = "/.bzr";
      local_178 = 0;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_1a0;
      cmCatViews(&local_1c0,views_00);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
      iVar5 = 3;
      if (!bVar3) {
        local_1a0._8_8_ = (dir->_M_dataplus)._M_p;
        local_1a0._0_8_ = dir->_M_string_length;
        local_190._M_allocated_capacity = 0;
        local_190._8_8_ = 5;
        local_180 = "/.git";
        local_178 = 0;
        views_01._M_len = 2;
        views_01._M_array = (iterator)local_1a0;
        cmCatViews(&local_1c0,views_01);
        std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
        iVar5 = 4;
        if (!bVar3) {
          local_1a0._8_8_ = (dir->_M_dataplus)._M_p;
          local_1a0._0_8_ = dir->_M_string_length;
          local_190._M_allocated_capacity = 0;
          local_190._8_8_ = 4;
          local_180 = "/.hg";
          local_178 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_1a0;
          cmCatViews(&local_1c0,views_02);
          std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
          iVar5 = 5;
          if (!bVar3) {
            local_1a0._8_8_ = (dir->_M_dataplus)._M_p;
            local_1a0._0_8_ = dir->_M_string_length;
            local_190._M_allocated_capacity = 0;
            local_190._8_8_ = 4;
            local_180 = "/.p4";
            local_178 = 0;
            views_03._M_len = 2;
            views_03._M_array = (iterator)local_1a0;
            cmCatViews(&local_1c0,views_03);
            std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_1c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != paVar1) {
              operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1
                             );
            }
            bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
            iVar5 = 6;
            if (!bVar3) {
              cmStrCat<std::__cxx11::string_const&,char_const(&)[11]>
                        ((string *)local_1a0,dir,(char (*) [11])"/.p4config");
              std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_1a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._0_8_ != &local_190) {
                operator_delete((void *)local_1a0._0_8_,(ulong)(local_190._M_allocated_capacity + 1)
                               );
              }
              bVar3 = cmsys::SystemTools::FileExists(&local_1e0);
              iVar5 = 6;
              if (!bVar3) {
                iVar5 = 0;
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const std::string& dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = cmStrCat(dir, "/CVS");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = cmStrCat(dir, "/.bzr");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = cmStrCat(dir, "/.git");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = cmStrCat(dir, "/.hg");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = cmStrCat(dir, "/.p4");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = cmStrCat(dir, "/.p4config");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}